

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode do_init_writer_stack(Curl_easy *data)

{
  CURLcode CVar1;
  Curl_cwriter *writer_00;
  Curl_cwriter *writer;
  
  CVar1 = Curl_cwriter_create(&(data->req).writer_stack,data,&Curl_cwt_out,CURL_CW_CLIENT);
  if ((CVar1 == CURLE_OK) &&
     (CVar1 = Curl_cwriter_create(&writer,data,&Curl_cwt_pause,CURL_CW_PROTOCOL), writer_00 = writer
     , CVar1 == CURLE_OK)) {
    CVar1 = Curl_cwriter_add(data,writer);
    if (CVar1 == CURLE_OK) {
      CVar1 = Curl_cwriter_create(&writer,data,&cw_download,CURL_CW_PROTOCOL);
      writer_00 = writer;
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
      CVar1 = Curl_cwriter_add(data,writer);
      if (CVar1 == CURLE_OK) {
        CVar1 = Curl_cwriter_create(&writer,data,&cw_raw,CURL_CW_RAW);
        if (CVar1 != CURLE_OK) {
          return CVar1;
        }
        CVar1 = Curl_cwriter_add(data,writer);
        writer_00 = writer;
        if (CVar1 == CURLE_OK) {
          return CURLE_OK;
        }
      }
    }
    Curl_cwriter_free(data,writer_00);
  }
  return CVar1;
}

Assistant:

static CURLcode do_init_writer_stack(struct Curl_easy *data)
{
  struct Curl_cwriter *writer;
  CURLcode result;

  DEBUGASSERT(!data->req.writer_stack);
  result = Curl_cwriter_create(&data->req.writer_stack,
                               data, &Curl_cwt_out, CURL_CW_CLIENT);
  if(result)
    return result;

  /* This places the "pause" writer behind the "download" writer that
   * is added below. Meaning the "download" can do checks on content length
   * and other things *before* write outs are buffered for paused transfers. */
  result = Curl_cwriter_create(&writer, data, &Curl_cwt_pause,
                               CURL_CW_PROTOCOL);
  if(!result) {
    result = Curl_cwriter_add(data, writer);
    if(result)
      Curl_cwriter_free(data, writer);
  }
  if(result)
    return result;

  result = Curl_cwriter_create(&writer, data, &cw_download, CURL_CW_PROTOCOL);
  if(!result) {
    result = Curl_cwriter_add(data, writer);
    if(result)
      Curl_cwriter_free(data, writer);
  }
  if(result)
    return result;

  result = Curl_cwriter_create(&writer, data, &cw_raw, CURL_CW_RAW);
  if(!result) {
    result = Curl_cwriter_add(data, writer);
    if(result)
      Curl_cwriter_free(data, writer);
  }
  if(result)
    return result;

  return result;
}